

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall QOpenGLFunctions::glUseProgram(QOpenGLFunctions *this,GLuint program)

{
  undefined4 in_ESI;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x418))(in_ESI);
  return;
}

Assistant:

inline void QOpenGLFunctions::glUseProgram(GLuint program)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glUseProgram(program);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.UseProgram(program);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}